

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void printUsage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"usage: fasttext <command> <args>\n\n");
  poVar1 = std::operator<<(poVar1,"The commands supported by fasttext are:\n\n");
  poVar1 = std::operator<<(poVar1,"  supervised          train a supervised classifier\n");
  poVar1 = std::operator<<(poVar1,"  test                evaluate a supervised classifier\n");
  poVar1 = std::operator<<(poVar1,"  predict             predict most likely labels\n");
  poVar1 = std::operator<<(poVar1,
                           "  predict-prob        predict most likely labels with probabilities\n");
  poVar1 = std::operator<<(poVar1,"  skipgram            train a skipgram model\n");
  poVar1 = std::operator<<(poVar1,"  cbow                train a cbow model\n");
  poVar1 = std::operator<<(poVar1,"  print-vectors       print vectors given a trained model\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printUsage() {
  std::cout
    << "usage: fasttext <command> <args>\n\n"
    << "The commands supported by fasttext are:\n\n"
    << "  supervised          train a supervised classifier\n"
    << "  test                evaluate a supervised classifier\n"
    << "  predict             predict most likely labels\n"
    << "  predict-prob        predict most likely labels with probabilities\n"
    << "  skipgram            train a skipgram model\n"
    << "  cbow                train a cbow model\n"
    << "  print-vectors       print vectors given a trained model\n"
    << std::endl;
}